

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::ClearSolution(LpSolver *this)

{
  Model *in_RDI;
  pointer in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe28;
  valarray<double> *in_stack_fffffffffffffe30;
  
  std::unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::reset
            ((unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)in_RDI,
             in_stack_fffffffffffffe18);
  std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::reset
            ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)in_RDI,
             (pointer)in_stack_fffffffffffffe18);
  std::valarray<double>::resize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(double)in_RDI);
  std::valarray<double>::resize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(double)in_RDI);
  std::valarray<double>::resize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(double)in_RDI);
  std::valarray<double>::resize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(double)in_RDI);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x837132);
  std::vector<int,_std::allocator<int>_>::shrink_to_fit
            ((vector<int,_std::allocator<int>_> *)0x837143);
  Info::Info((Info *)0x83714d);
  memcpy(&in_RDI[2].AI_.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish,&stack0xfffffffffffffe28,0x1d0);
  Model::GetInfo(in_RDI,(Info *)in_stack_fffffffffffffe18);
  return;
}

Assistant:

void LpSolver::ClearSolution() {
    iterate_.reset(nullptr);
    basis_.reset(nullptr);
    x_crossover_.resize(0);
    y_crossover_.resize(0);
    z_crossover_.resize(0);
    crossover_weights_.resize(0);
    basic_statuses_.clear();
    basic_statuses_.shrink_to_fit();
    info_ = Info();
    // Restore info entries that belong to model.
    model_.GetInfo(&info_);

}